

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O0

void __thiscall SQLiteTestFixture::teardown(SQLiteTestFixture *this)

{
  unit_test_log_t *this_00;
  bool bVar1;
  element_type *conn;
  lazy_ostream *prev;
  basic_cstring<const_char> local_d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[94],_const_char_(&)[94]> local_c0;
  assertion_result local_a0;
  basic_cstring<const_char> local_88;
  basic_cstring<const_char> local_78 [2];
  allocator<char> local_51;
  string local_50;
  statement local_30;
  SQLiteTestFixture *local_10;
  SQLiteTestFixture *this_local;
  
  local_10 = this;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"drop table TEST_TABLE;",&local_51);
    conn = std::__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this);
    cpp_db::statement::statement(&local_30,&local_50,conn);
    cpp_db::statement::execute_non_query(&local_30);
    cpp_db::statement::~statement(&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    do {
      this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_88);
      boost::unit_test::unit_test_log_t::set_checkpoint(this_00,local_78,0x23,&local_88);
      boost::test_tools::assertion_result::assertion_result(&local_a0,true);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_c0,prev,
                 (char (*) [94])
                 "no exceptions thrown by cpp_db::statement(\"drop table TEST_TABLE;\", *con).execute_non_query()"
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::test_tools::tt_detail::report_assertion
                (&local_a0,&local_c0.super_lazy_ostream,&local_d0,0x23,CHECK,CHECK_MSG,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[94],_const_char_(&)[94]>::
      ~lazy_ostream_impl(&local_c0);
      boost::test_tools::assertion_result::~assertion_result(&local_a0);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  return;
}

Assistant:

void teardown()
    {
        BOOST_CHECK_NO_THROW(cpp_db::statement("drop table TEST_TABLE;", *con).execute_non_query());
    }